

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

void enet_peer_reset(ENetPeer *peer)

{
  size_t *psVar1;
  
  if (peer->state - ENET_PEER_STATE_CONNECTED < 2) {
    if (peer->incomingBandwidth != 0) {
      psVar1 = &peer->host->bandwidthLimitedPeers;
      *psVar1 = *psVar1 - 1;
    }
    psVar1 = &peer->host->connectedPeers;
    *psVar1 = *psVar1 - 1;
  }
  peer->outgoingPeerID = 0xffff;
  peer->state = ENET_PEER_STATE_DISCONNECTED;
  peer->totalDataReceived = 0;
  peer->outgoingDataTotal = 0;
  peer->incomingBandwidth = 0;
  peer->outgoingBandwidth = 0;
  peer->incomingBandwidthThrottleEpoch = 0;
  peer->outgoingBandwidthThrottleEpoch = 0;
  peer->incomingDataTotal = 0;
  peer->totalDataSent = 0;
  peer->lastSendTime = 0;
  peer->lastReceiveTime = 0;
  peer->nextTimeout = 0;
  peer->earliestTimeout = 0;
  peer->packetLossEpoch = 0;
  peer->packetsSent = 0;
  peer->totalPacketsSent = 0;
  peer->packetsLost = 0;
  peer->totalPacketsLost = 0;
  peer->packetLoss = 0;
  peer->packetLossVariance = 0;
  peer->packetThrottle = 0x20;
  peer->packetThrottleLimit = 0x20;
  peer->packetThrottleCounter = 0;
  peer->packetThrottleEpoch = 0;
  peer->packetThrottleAcceleration = 2;
  peer->packetThrottleDeceleration = 2;
  peer->packetThrottleInterval = 5000;
  peer->pingInterval = 500;
  peer->timeoutLimit = 0x20;
  peer->timeoutMinimum = 5000;
  peer->timeoutMaximum = 30000;
  peer->lastRoundTripTime = 500;
  peer->lowestRoundTripTime = 500;
  peer->lastRoundTripTimeVariance = 0;
  peer->highestRoundTripTimeVariance = 0;
  peer->roundTripTime = 500;
  peer->roundTripTimeVariance = 0;
  peer->mtu = peer->host->mtu;
  peer->outgoingReliableSequenceNumber = 0;
  peer->windowSize = 0x10000;
  peer->reliableDataInTransit = 0;
  peer->totalWaitingData = 0;
  peer->flags = 0;
  memset(&peer->incomingUnsequencedGroup,0,0x88);
  enet_peer_reset_queues(peer);
  return;
}

Assistant:

void enet_peer_reset(ENetPeer *peer) {
        enet_peer_on_disconnect(peer);

        // We don't want to reset connectID here, otherwise, we can't get it in the Disconnect event
        // peer->connectID                     = 0;
        peer->outgoingPeerID                = ENET_PROTOCOL_MAXIMUM_PEER_ID;
        peer->state                         = ENET_PEER_STATE_DISCONNECTED;
        peer->incomingBandwidth             = 0;
        peer->outgoingBandwidth             = 0;
        peer->incomingBandwidthThrottleEpoch = 0;
        peer->outgoingBandwidthThrottleEpoch = 0;
        peer->incomingDataTotal             = 0;
        peer->totalDataReceived             = 0;
        peer->outgoingDataTotal             = 0;
        peer->totalDataSent                 = 0;
        peer->lastSendTime                  = 0;
        peer->lastReceiveTime               = 0;
        peer->nextTimeout                   = 0;
        peer->earliestTimeout               = 0;
        peer->packetLossEpoch               = 0;
        peer->packetsSent                   = 0;
        peer->totalPacketsSent              = 0;
        peer->packetsLost                   = 0;
        peer->totalPacketsLost              = 0;
        peer->packetLoss                    = 0;
        peer->packetLossVariance            = 0;
        peer->packetThrottle                = ENET_PEER_DEFAULT_PACKET_THROTTLE;
        peer->packetThrottleLimit           = ENET_PEER_PACKET_THROTTLE_SCALE;
        peer->packetThrottleCounter         = 0;
        peer->packetThrottleEpoch           = 0;
        peer->packetThrottleAcceleration    = ENET_PEER_PACKET_THROTTLE_ACCELERATION;
        peer->packetThrottleDeceleration    = ENET_PEER_PACKET_THROTTLE_DECELERATION;
        peer->packetThrottleInterval        = ENET_PEER_PACKET_THROTTLE_INTERVAL;
        peer->pingInterval                  = ENET_PEER_PING_INTERVAL;
        peer->timeoutLimit                  = ENET_PEER_TIMEOUT_LIMIT;
        peer->timeoutMinimum                = ENET_PEER_TIMEOUT_MINIMUM;
        peer->timeoutMaximum                = ENET_PEER_TIMEOUT_MAXIMUM;
        peer->lastRoundTripTime             = ENET_PEER_DEFAULT_ROUND_TRIP_TIME;
        peer->lowestRoundTripTime           = ENET_PEER_DEFAULT_ROUND_TRIP_TIME;
        peer->lastRoundTripTimeVariance     = 0;
        peer->highestRoundTripTimeVariance  = 0;
        peer->roundTripTime                 = ENET_PEER_DEFAULT_ROUND_TRIP_TIME;
        peer->roundTripTimeVariance         = 0;
        peer->mtu                           = peer->host->mtu;
        peer->reliableDataInTransit         = 0;
        peer->outgoingReliableSequenceNumber = 0;
        peer->windowSize                    = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
        peer->incomingUnsequencedGroup      = 0;
        peer->outgoingUnsequencedGroup      = 0;
        peer->eventData                     = 0;
        peer->totalWaitingData              = 0;
        peer->flags                         = 0;

        memset(peer->unsequencedWindow, 0, sizeof(peer->unsequencedWindow));
        enet_peer_reset_queues(peer);
    }